

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[6]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  StringCompare *this_00;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  char *in_RDX;
  size_t in_R8;
  StringPtr a;
  StringPtr b;
  Iterator iter;
  Iterator local_70;
  long local_58;
  long local_50;
  SearchKey local_48;
  char *local_40;
  long *local_38;
  
  local_40 = params[4] + 4;
  local_58 = *(long *)params;
  local_50 = *(long *)(params[1] + 1) - local_58 >> 4;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021b9b8;
  _::BTreeImpl::search(&local_70,(BTreeImpl *)(params[5] + 5),&local_48);
  if (((ulong)local_70.row != 0xe) && (uVar1 = (local_70.leaf)->rows[local_70.row].i, uVar1 != 0)) {
    lVar4 = (ulong)(uVar1 - 1) * 0x10;
    this_00 = *(StringCompare **)(local_58 + lVar4);
    pcVar2 = *(char **)(local_58 + 8 + lVar4);
    sVar5 = strlen(in_RDX);
    a.content.size_ = (size_t)in_RDX;
    a.content.ptr = pcVar2;
    b.content.size_ = in_R8;
    b.content.ptr = (char *)(sVar5 + 1);
    bVar3 = _::anon_unknown_0::StringCompare::matches(this_00,a,b);
    if (bVar3) {
      lVar4 = (ulong)((local_70.leaf)->rows[local_70.row].i - 1) * 0x10 + *(long *)params;
      goto LAB_0015ab30;
    }
  }
  lVar4 = 0;
LAB_0015ab30:
  *(long *)this = lVar4;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}